

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O2

void __thiscall
duckdb_parquet::BloomFilterCompression::printTo(BloomFilterCompression *this,ostream *out)

{
  string sStack_38;
  
  std::operator<<(out,"BloomFilterCompression(");
  std::operator<<(out,"UNCOMPRESSED=");
  if (((byte)this->__isset & 1) == 0) {
    std::operator<<(out,"<null>");
  }
  else {
    duckdb_apache::thrift::to_string<duckdb_parquet::Uncompressed>(&sStack_38,&this->UNCOMPRESSED);
    std::operator<<(out,(string *)&sStack_38);
    std::__cxx11::string::~string((string *)&sStack_38);
  }
  std::operator<<(out,")");
  return;
}

Assistant:

void BloomFilterCompression::printTo(std::ostream& out) const {
  using ::apache::thrift::to_string;
  out << "BloomFilterCompression(";
  out << "UNCOMPRESSED="; (__isset.UNCOMPRESSED ? (out << to_string(UNCOMPRESSED)) : (out << "<null>"));
  out << ")";
}